

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix4f> *value)

{
  bool bVar1;
  undefined1 local_64 [8];
  matrix4f v;
  optional<tinyusdz::value::matrix4f> *value_local;
  AsciiParser *this_local;
  
  unique0x1000007d = value;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::operator=(stack0xffffffffffffffe0);
    this_local._7_1_ = true;
  }
  else {
    tinyusdz::value::matrix4f::matrix4f((matrix4f *)local_64);
    bVar1 = ReadBasicType(this,(matrix4f *)local_64);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::operator=
                (stack0xffffffffffffffe0,(matrix4f *)local_64);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix4f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix4f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}